

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuDefs.cpp
# Opt level: O3

string * __thiscall
tcu::formatError_abi_cxx11_
          (string *__return_storage_ptr__,tcu *this,char *message,char *expr,char *file,int line)

{
  size_t sVar1;
  ostream *this_00;
  string *psVar2;
  char *__s;
  ostringstream msg;
  allocator<char> local_1ed;
  int local_1ec;
  string local_1e8;
  FilePath local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1ec = (int)file;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  __s = "Runtime check failed";
  if (this != (tcu *)0x0) {
    __s = (char *)this;
  }
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar1);
  if (message != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,": \'",3);
    sVar1 = strlen(message);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,message,sVar1);
    local_1e8._M_dataplus._M_p._0_1_ = 0x27;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1e8,1);
  }
  if (expr != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at ",4);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,expr,&local_1ed);
    de::FilePath::getBaseName_abi_cxx11_(&local_1e8,&local_1c8);
    this_00 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         (char *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,
                                          local_1e8._M_dataplus._M_p._0_1_),
                         local_1e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,":",1);
    std::ostream::operator<<(this_00,local_1ec);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_) !=
        &local_1e8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_),
                      local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.m_path._M_dataplus._M_p != &local_1c8.m_path.field_2) {
      operator_delete(local_1c8.m_path._M_dataplus._M_p,
                      local_1c8.m_path.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  psVar2 = (string *)std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

static std::string formatError (const char* message, const char* expr, const char* file, int line)
{
	std::ostringstream msg;
	msg << (message ? message : "Runtime check failed");

	if (expr)
		msg << ": '" << expr << '\'';

	if (file)
		msg << " at " << de::FilePath(file).getBaseName() << ":" << line;

	return msg.str();
}